

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_binder.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::IndexBinder::BindExpression
          (BindResult *__return_storage_ptr__,IndexBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  ExpressionClass EVar1;
  type expr;
  BinderException BStack_58;
  string local_48;
  
  expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*(expr_ptr);
  EVar1 = (expr->super_BaseExpression).expression_class;
  if (EVar1 == SUBQUERY) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"cannot use subquery in index expressions","");
    BinderException::Unsupported(&BStack_58,expr,&local_48);
    BindResult::BindResult(__return_storage_ptr__,&BStack_58.super_Exception);
  }
  else {
    if (EVar1 != WINDOW) {
      ExpressionBinder::BindExpression
                (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
      return __return_storage_ptr__;
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"window functions are not allowed in index expressions","");
    BinderException::Unsupported(&BStack_58,expr,&local_48);
    BindResult::BindResult(__return_storage_ptr__,&BStack_58.super_Exception);
  }
  ::std::runtime_error::~runtime_error((runtime_error *)&BStack_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult IndexBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::WINDOW:
		return BindResult(BinderException::Unsupported(expr, "window functions are not allowed in index expressions"));
	case ExpressionClass::SUBQUERY:
		return BindResult(BinderException::Unsupported(expr, "cannot use subquery in index expressions"));
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}